

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MSX.cpp
# Opt level: O2

void __thiscall MSX::AYPortHandler::Joystick::Joystick(Joystick *this)

{
  initializer_list<Inputs::Joystick::Input> __l;
  allocator_type local_89;
  _Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> local_88;
  Input local_70;
  undefined4 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined8 local_48;
  undefined4 local_40;
  undefined8 local_38;
  undefined4 local_30;
  undefined8 local_28;
  undefined4 local_20;
  undefined8 local_18;
  
  local_70.type = Up;
  local_70.info = (Info)0x0;
  local_60 = 1;
  local_58 = 0;
  local_50 = 2;
  local_48 = 0;
  local_40 = 3;
  local_38 = 0;
  local_30 = 6;
  local_28 = 0;
  local_18 = 1;
  __l._M_len = 6;
  __l._M_array = &local_70;
  local_20 = local_30;
  std::vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::vector
            ((vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_88,
             __l,&local_89);
  Inputs::ConcreteJoystick::ConcreteJoystick
            (&this->super_ConcreteJoystick,
             (vector<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_> *)&local_88)
  ;
  std::_Vector_base<Inputs::Joystick::Input,_std::allocator<Inputs::Joystick::Input>_>::
  ~_Vector_base(&local_88);
  (this->super_ConcreteJoystick).super_Joystick._vptr_Joystick =
       (_func_int **)&PTR__ConcreteJoystick_00586278;
  this->state_ = 0xff;
  return;
}

Assistant:

Joystick() :
					ConcreteJoystick({
						Input(Input::Up),
						Input(Input::Down),
						Input(Input::Left),
						Input(Input::Right),
						Input(Input::Fire, 0),
						Input(Input::Fire, 1),
					}) {}